

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall
double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint factor;
  int shift_amount;
  bool bVar9;
  
  uVar4 = (ulong)base;
  if (power_exponent != 0) {
    this->used_bigits_ = 0;
    this->exponent_ = 0;
    shift_amount = 0;
    while( true ) {
      factor = (uint)uVar4;
      if ((uVar4 & 1) != 0) break;
      uVar4 = (ulong)(factor >> 1);
      shift_amount = shift_amount + power_exponent;
    }
    bVar7 = 0;
    iVar1 = 0;
    for (uVar5 = uVar4; (uint)uVar5 != 0; uVar5 = (ulong)((uint)uVar5 >> 1)) {
      bVar7 = bVar7 - 1;
      iVar1 = iVar1 + power_exponent;
    }
    EnsureCapacity(iVar1 / 0x1c + 2);
    iVar1 = 1;
    do {
      iVar2 = iVar1;
      iVar1 = iVar2 * 2;
    } while (iVar2 <= power_exponent);
    uVar8 = iVar2 >> 2;
    bVar3 = false;
    uVar5 = uVar4;
    while ((uVar8 != 0 && (uVar5 >> 0x20 == 0))) {
      uVar5 = uVar5 * uVar5;
      if ((uVar8 & power_exponent) != 0) {
        bVar9 = uVar5 >> (bVar7 & 0x3f) != 0;
        uVar6 = 1;
        if (!bVar9) {
          uVar6 = uVar4;
        }
        uVar5 = uVar5 * uVar6;
        bVar3 = (bool)(bVar3 | bVar9);
      }
      uVar8 = (int)uVar8 >> 1;
    }
    AssignUInt64(this,uVar5);
    if (bVar3) {
      MultiplyByUInt32(this,factor);
    }
    for (; uVar8 != 0; uVar8 = (int)uVar8 >> 1) {
      Square(this);
      if ((uVar8 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
    }
    ShiftLeft(this,shift_amount);
    return;
  }
  this->used_bigits_ = 1;
  this->exponent_ = 0;
  this->bigits_buffer_[0] = 1;
  return;
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, const int power_exponent) {
  DOUBLE_CONVERSION_ASSERT(base != 0);
  DOUBLE_CONVERSION_ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  const int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multiplication = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      DOUBLE_CONVERSION_ASSERT(bit_size > 0);
      const uint64_t base_bits_mask =
        ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      const bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multiplication = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multiplication) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}